

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::Mutex::InternalAttemptToUseMutexInFatalSignalHandler(void)

{
  ThreadIdentity *pTVar1;
  ThreadIdentity *identity;
  
  pTVar1 = base_internal::CurrentThreadIdentityIfPresent();
  if (pTVar1 != (ThreadIdentity *)0x0) {
    (pTVar1->per_thread_synch).suppress_fatal_errors = true;
  }
  std::atomic<absl::OnDeadlockCycle>::store
            ((atomic<absl::OnDeadlockCycle> *)&(anonymous_namespace)::synch_deadlock_detection,
             kIgnore,memory_order_release);
  return;
}

Assistant:

void Mutex::InternalAttemptToUseMutexInFatalSignalHandler() {
  // Fix the per-thread state only if it exists.
  ThreadIdentity *identity = CurrentThreadIdentityIfPresent();
  if (identity != nullptr) {
    identity->per_thread_synch.suppress_fatal_errors = true;
  }
  // Don't do deadlock detection when we are already failing.
  synch_deadlock_detection.store(OnDeadlockCycle::kIgnore,
                                 std::memory_order_release);
}